

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O3

void anon_unknown.dwarf_d1b66::append_rewrite_rule(RewriteRules *r,char *str)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  ostream *poVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  string tmp;
  char *local_58;
  undefined8 local_50;
  char local_48 [16];
  char *local_38 [3];
  
  sVar2 = strlen(str);
  pcVar3 = str + sVar2;
  ppcVar5 = local_38;
  uVar8 = 0;
  pcVar6 = str;
  do {
    pcVar1 = pcVar6;
    if (2 < uVar8) goto LAB_00163590;
    for (; ((pcVar7 = pcVar3, pcVar1 != pcVar3 && (pcVar7 = pcVar1, *pcVar1 != '\t')) &&
           (*pcVar1 != ' ')); pcVar1 = pcVar1 + 1) {
    }
    *pcVar7 = '\0';
    if (*pcVar6 != '\0') {
      *ppcVar5 = pcVar6;
      ppcVar5 = ppcVar5 + 1;
      uVar8 = uVar8 + 1;
    }
    pcVar6 = pcVar7 + 1;
  } while (pcVar7 != pcVar3);
  if (uVar8 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"n >= 2",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"format error: ",0xe);
    if (str == (char *)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar2 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,str,sVar2);
    }
    MeCab::die::~die((die *)&local_58);
  }
LAB_00163590:
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::resize
            (&r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>,
             ((long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>)
                    .
                    super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>)
                    .
                    super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 + 1);
  local_50 = 0;
  local_48[0] = '\0';
  local_58 = local_48;
  if (2 < uVar8) {
    strlen(local_38[1]);
    std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38[1]);
    std::__cxx11::string::push_back((char)&local_58);
    std::__cxx11::string::append((char *)&local_58);
    local_38[1] = local_58;
  }
  MeCab::RewritePattern::set_pattern
            ((r->super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>).
             super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1,local_38[0],local_38[1]);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void append_rewrite_rule(RewriteRules *r, char* str) {
  char *col[3];
  const size_t n = tokenize2(str, " \t", col, 3);
  CHECK_DIE(n >= 2) << "format error: " << str;
  r->resize(r->size() + 1);
  std::string tmp;
  if (n >= 3) {
    tmp = col[1];
    tmp += ' ';
    tmp += col[2];
    col[1] = const_cast<char *>(tmp.c_str());
  }
  r->back().set_pattern(col[0], col[1]);
}